

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O0

bool __thiscall tcu::App::iterate(App *this)

{
  uint uVar1;
  RunMode RVar2;
  CommandLine *this_00;
  TestRunStatus *pTVar3;
  bool local_85;
  float local_84;
  float local_78;
  float local_6c;
  float local_60;
  TestRunStatus *result;
  RunMode runMode;
  exception *e;
  bool local_1a;
  bool testExecOk;
  bool platformOk;
  App *this_local;
  
  if (this->m_testExecutor == (TestSessionExecutor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (*this->m_platform->_vptr_Platform[2])();
    local_1a = false;
    if ((uVar1 & 1) != 0) {
      local_1a = TestSessionExecutor::iterate(this->m_testExecutor);
    }
    if (((uVar1 & 1) == 0) || (local_1a == false)) {
      if ((uVar1 & 1) == 0) {
        print("\nABORTED!\n");
      }
      else {
        print("\nDONE!\n");
      }
      this_00 = TestContext::getCommandLine(this->m_testCtx);
      RVar2 = CommandLine::getRunMode(this_00);
      if (RVar2 == RUNMODE_EXECUTE) {
        pTVar3 = TestSessionExecutor::getStatus(this->m_testExecutor);
        print("\nTest run totals:\n");
        if (pTVar3->numExecuted < 1) {
          local_60 = 0.0;
        }
        else {
          local_60 = ((float)pTVar3->numPassed * 100.0) / (float)pTVar3->numExecuted;
        }
        print("  Passed:        %d/%d (%.1f%%)\n",(double)local_60,(ulong)(uint)pTVar3->numPassed,
              (ulong)(uint)pTVar3->numExecuted);
        if (pTVar3->numExecuted < 1) {
          local_6c = 0.0;
        }
        else {
          local_6c = ((float)pTVar3->numFailed * 100.0) / (float)pTVar3->numExecuted;
        }
        print("  Failed:        %d/%d (%.1f%%)\n",(double)local_6c,(ulong)(uint)pTVar3->numFailed,
              (ulong)(uint)pTVar3->numExecuted);
        if (pTVar3->numExecuted < 1) {
          local_78 = 0.0;
        }
        else {
          local_78 = ((float)pTVar3->numNotSupported * 100.0) / (float)pTVar3->numExecuted;
        }
        print("  Not supported: %d/%d (%.1f%%)\n",(double)local_78,
              (ulong)(uint)pTVar3->numNotSupported,(ulong)(uint)pTVar3->numExecuted);
        if (pTVar3->numExecuted < 1) {
          local_84 = 0.0;
        }
        else {
          local_84 = ((float)pTVar3->numWarnings * 100.0) / (float)pTVar3->numExecuted;
        }
        print("  Warnings:      %d/%d (%.1f%%)\n",(double)local_84,(ulong)(uint)pTVar3->numWarnings,
              (ulong)(uint)pTVar3->numExecuted);
        if ((pTVar3->isComplete & 1U) == 0) {
          print("Test run was ABORTED!\n");
        }
      }
    }
    local_85 = false;
    if ((uVar1 & 1) != 0) {
      local_85 = local_1a;
    }
    this_local._7_1_ = local_85;
  }
  return this_local._7_1_;
}

Assistant:

bool App::iterate (void)
{
	if (!m_testExecutor)
	{
		DE_ASSERT(m_testCtx->getCommandLine().getRunMode() != RUNMODE_EXECUTE);
		return false;
	}

	// Poll platform events
	const bool platformOk = m_platform.processEvents();

	// Iterate a step.
	bool testExecOk = false;
	if (platformOk)
	{
		try
		{
			testExecOk = m_testExecutor->iterate();
		}
		catch (const std::exception& e)
		{
			die("%s", e.what());
		}
	}

	if (!platformOk || !testExecOk)
	{
		if (!platformOk)
			print("\nABORTED!\n");
		else
			print("\nDONE!\n");

		const RunMode runMode = m_testCtx->getCommandLine().getRunMode();
		if (runMode == RUNMODE_EXECUTE)
		{
			const TestRunStatus& result = m_testExecutor->getStatus();

			// Report statistics.
			print("\nTest run totals:\n");
			print("  Passed:        %d/%d (%.1f%%)\n", result.numPassed,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numPassed			/ (float)result.numExecuted) : 0.0f));
			print("  Failed:        %d/%d (%.1f%%)\n", result.numFailed,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numFailed			/ (float)result.numExecuted) : 0.0f));
			print("  Not supported: %d/%d (%.1f%%)\n", result.numNotSupported,	result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numNotSupported	/ (float)result.numExecuted) : 0.0f));
			print("  Warnings:      %d/%d (%.1f%%)\n", result.numWarnings,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numWarnings		/ (float)result.numExecuted) : 0.0f));
			if (!result.isComplete)
				print("Test run was ABORTED!\n");
		}
	}

	return platformOk && testExecOk;
}